

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

Vec_Int_t * Emb_ManConnectedComponents(Emb_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *p_01;
  Vec_Int_t *vNext;
  int *piVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  long lVar7;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  piVar2 = (int *)malloc(4000);
  p_01->pArray = piVar2;
  vNext = (Vec_Int_t *)malloc(0x10);
  vNext->nCap = 1000;
  vNext->nSize = 0;
  piVar3 = (int *)malloc(4000);
  vNext->pArray = piVar3;
  p->nReached = 0;
  p->nTravIds = p->nTravIds + 1;
  pGVar4 = p->pGia;
  pVVar5 = pGVar4->vCos;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      iVar1 = pVVar5->pArray[lVar7];
      if (((long)iVar1 < 0) || (pGVar4->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      uVar6 = (ulong)pGVar4->pObjs[iVar1].Value;
      piVar2 = p->pObjData;
      if (piVar2[uVar6 + 3] != p->nTravIds) {
        piVar2[uVar6 + 3] = p->nTravIds;
        Vec_IntPush(p_00,piVar2[uVar6 + 2]);
        p_01->nSize = 0;
        Vec_IntPush(p_01,piVar2[uVar6 + 2]);
        Emb_ManPerformBfs(p,p_01,vNext,(Emb_Dat_t *)0x0);
        pGVar4 = p->pGia;
      }
      lVar7 = lVar7 + 1;
      pVVar5 = pGVar4->vCos;
    } while (lVar7 < pVVar5->nSize);
    piVar2 = p_01->pArray;
  }
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(p_01);
  if (vNext->pArray != (int *)0x0) {
    free(vNext->pArray);
  }
  free(vNext);
  return p_00;
}

Assistant:

Vec_Int_t * Emb_ManConnectedComponents( Emb_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vThis, * vNext, * vResult;
    Emb_Obj_t * pThis;
    int i;
    vResult = Vec_IntAlloc( 1000 );
    vThis   = Vec_IntAlloc( 1000 );
    vNext   = Vec_IntAlloc( 1000 );
    p->nReached = 0;
    Emb_ManIncrementTravId( p );
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        pThis = Emb_ManObj( p, Gia_ObjValue(pObj) );
        if ( Emb_ObjIsTravIdCurrent(p, pThis) )
            continue;
        Emb_ObjSetTravIdCurrent( p, pThis );
        Vec_IntPush( vResult, pThis->hHandle );
        // perform BFS from this node
        Vec_IntClear( vThis );
        Vec_IntPush( vThis, pThis->hHandle );
        Emb_ManPerformBfs( p, vThis, vNext, NULL ); 
    }
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    return vResult;
}